

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owner.cpp
# Opt level: O3

string * fs_get_owner_group_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  int iVar1;
  int *piVar2;
  group *pgVar3;
  string_view fname;
  statx sx;
  stat sStack_1a8;
  allocator<char> local_118 [24];
  __gid_t local_100;
  
  iVar1 = statx(0xffffff9c,path._M_str,0x800,0x10,local_118);
  if (((iVar1 == 0) ||
      ((piVar2 = __errno_location(), *piVar2 == 0x26 &&
       (iVar1 = stat(path._M_str,&sStack_1a8), local_100 = sStack_1a8.st_gid, iVar1 == 0)))) &&
     (pgVar3 = getgrgid(local_100), pgVar3 != (group *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pgVar3->gr_name,local_118);
  }
  else {
    fname._M_str = "fs_get_owner_group";
    fname._M_len = 0x12;
    fs_print_error(path,fname);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_get_owner_group(std::string_view path)
{
#if defined(_WIN32)
  if (std::string s = fs_win32_owner(path, true); !s.empty())
    return s;
#else
  if (auto gid = fs_stat_gid(path)) {
    if (auto gr = getgrgid(gid.value()))
      return gr->gr_name;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}